

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void assemble_text(ifstream *in,ofstream *out,bool run)

{
  pointer this;
  exception *e;
  undefined1 local_90 [16];
  type avm;
  undefined1 local_70 [8];
  File f;
  bool run_local;
  ofstream *out_local;
  ifstream *in_local;
  
  f.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = run;
  File::parse_file_text((File *)local_70,in);
  File::output_binary((File *)local_70,out);
  if ((f.functions.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    File::File((File *)&e,(File *)local_70);
    vm::VM::make_vm((VM *)local_90,(File *)&e);
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)(local_90 + 8),
               (unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_90);
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)local_90);
    File::~File((File *)&e);
    this = std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::operator->
                     ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)(local_90 + 8));
    vm::VM::start(this);
    std::unique_ptr<vm::VM,_std::default_delete<vm::VM>_>::~unique_ptr
              ((unique_ptr<vm::VM,_std::default_delete<vm::VM>_> *)(local_90 + 8));
  }
  File::~File((File *)local_70);
  return;
}

Assistant:

void assemble_text(std::ifstream* in, std::ofstream* out, bool run = false) {
    try {
        File f = File::parse_file_text(*in);
        // f.output_text(std::cout);
        f.output_binary(*out);
        if (run) {
            auto avm = std::move(vm::VM::make_vm(f));
            avm->start();
        }
    }
    catch (const std::exception& e) {
        println(std::cerr, e.what());
    }
}